

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>
          (MessageGenerator *this,FieldDescriptor *field,Printer *p,int *cached_has_word_index)

{
  long lVar1;
  allocator<char> local_31b;
  allocator<char> local_31a;
  allocator<char> local_319;
  string local_318;
  string local_2f8;
  Printer *p_local;
  FieldDescriptor *field_local;
  string local_2c8;
  anon_class_24_3_4e50317f_for_cb local_2a8;
  anon_class_24_3_0cc8e12b_for_cb local_290;
  anon_class_32_4_7d5c8e9e_for_cb local_278;
  Sub local_258 [3];
  
  p_local = p;
  field_local = field;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"comment",&local_319);
  local_290.p = &p_local;
  local_290.field = &field_local;
  local_290.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_1_>
            (local_258,&local_2c8,&local_290);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"update_cached_has_bits",&local_31a);
  local_278.this = this;
  local_278.field = &field_local;
  local_278.p = &p_local;
  local_278.cached_has_word_index = cached_has_word_index;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_2_>
            (local_258 + 1,&local_2f8,&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"check_and_update_byte_size_for_field",&local_31b);
  local_2a8.field = &field_local;
  local_2a8.p = &p_local;
  local_2a8.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::EmitUpdateByteSizeForField<false>(google::protobuf::FieldDescriptor_const*,google::protobuf::io::Printer*,int&)const::_lambda()_3_>
            (local_258 + 2,&local_318,&local_2a8);
  io::Printer::Emit(p,local_258,3,0x6c,
                    "\n        $comment$;\n        $update_cached_has_bits$;\n        $check_and_update_byte_size_for_field$;\n      "
                   );
  lVar1 = 0x170;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_258[0].key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2c8);
  return;
}

Assistant:

void MessageGenerator::EmitUpdateByteSizeForField(
    const FieldDescriptor* field, io::Printer* p,
    int& cached_has_word_index) const {
  p->Emit(
      {{"comment", [&] { PrintFieldComment(Formatter{p}, field, options_); }},
       {"update_cached_has_bits",
        [&] { MaybeEmitUpdateCachedHasbits(field, p, cached_has_word_index); }},
       {"check_and_update_byte_size_for_field",
        [&]() { EmitCheckAndUpdateByteSizeForField<kIsV2>(field, p); }}},
      R"cc(
        $comment$;
        $update_cached_has_bits$;
        $check_and_update_byte_size_for_field$;
      )cc");
}